

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4)

{
  string_view value;
  string_view format_00;
  Arg *in_stack_fffffffffffffe38;
  Arg local_178;
  Arg local_148;
  Arg local_118;
  Arg local_e8;
  size_t local_b8;
  char *pcStack_b0;
  Arg local_a8;
  lts_20250127 *local_78;
  char *pcStack_70;
  string local_68;
  string_view local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_1;
  basic_string_view<char,_std::char_traits<char>_> *arg_local;
  Output *this_local;
  string_view format_local;
  
  pcStack_70 = format._M_str;
  local_78 = (lts_20250127 *)format._M_len;
  local_b8 = arg->_M_len;
  pcStack_b0 = arg->_M_str;
  value._M_len = arg->_M_len;
  value._M_str = arg->_M_str;
  local_38 = arg_2;
  arg_local_2 = arg_1;
  arg_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg;
  arg_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (Output *)local_78;
  format_local._M_len = (size_t)pcStack_70;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_a8,value);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_e8,arg_local_2);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_118,local_38);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_148,arg_3);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_178,arg_4);
  format_00._M_str = (char *)&local_a8;
  format_00._M_len = (size_t)pcStack_70;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_68,local_78,format_00,&local_e8,&local_118,&local_148,&local_178,
             in_stack_fffffffffffffe38);
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
  Write(this,local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }